

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O2

bool iDynTree::CompositeRigidBodyAlgorithm
               (Model *model,Traversal *traversal,JointPosDoubleArray *jointPos,
               LinkCompositeRigidBodyInertias *linkCRBs,FreeFloatingMassMatrix *massMatrix)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  PointerType pdVar4;
  double dVar5;
  double dVar6;
  Link *pLVar7;
  LinkIndex LVar8;
  SpatialInertia *pSVar9;
  SpatialInertia *this;
  Link *this_00;
  IJoint *pIVar10;
  LinkIndex LVar11;
  undefined4 extraout_var;
  LinkIndex LVar12;
  undefined4 extraout_var_00;
  double *pdVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint traversalEl;
  ulong uVar14;
  Matrix<double,_6,_1,_0,_6,_1> FEigen;
  SpatialForceVector F;
  Matrix6x6 lockedInertia;
  SpatialMotionVector S_visitedDof;
  double local_278;
  Matrix<double,_6,_1,_0,_6,_1> local_228;
  long lStack_1f8;
  undefined1 local_1e8 [40];
  double local_1c0;
  variable_if_dynamic<long,__1> vStack_1b8;
  variable_if_dynamic<long,__1> vStack_1b0;
  double local_1a8;
  undefined1 local_180 [48];
  variable_if_dynamic<long,__1> local_150;
  variable_if_dynamic<long,__1> local_148;
  double local_140;
  SpatialVector<iDynTree::SpatialMotionVector> local_60;
  
  pdVar4 = (PointerType)iDynTree::MatrixDynSize::data();
  dVar5 = (double)iDynTree::MatrixDynSize::rows();
  dVar6 = (double)iDynTree::MatrixDynSize::cols();
  uVar14 = 0;
  while( true ) {
    uVar2 = Traversal::getNrOfVisitedLinks(traversal);
    if (uVar2 <= uVar14) break;
    pLVar7 = Traversal::getLink(traversal,uVar14);
    LVar8 = Link::getIndex(pLVar7);
    pSVar9 = Link::getInertia(pLVar7);
    this = LinkInertias::operator()(linkCRBs,LVar8);
    SpatialInertia::operator=(this,pSVar9);
    uVar14 = uVar14 + 1;
  }
  uVar2 = Traversal::getNrOfVisitedLinks(traversal);
LAB_00193bfd:
  do {
    do {
      uVar2 = uVar2 - 1;
      if ((int)uVar2 < 0) {
        pLVar7 = Traversal::getLink(traversal,0);
        LVar8 = Link::getIndex(pLVar7);
        LinkInertias::operator()(linkCRBs,LVar8);
        iDynTree::SpatialInertia::asMatrix();
        vStack_1b8.m_value = 0;
        vStack_1b0.m_value = 0;
        local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0] = (double)local_180;
        local_1e8._0_8_ = pdVar4;
        local_1e8._16_8_ = pdVar4;
        local_1e8._24_8_ = dVar5;
        local_1e8._32_8_ = dVar6;
        local_1a8 = dVar6;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,6,6,false>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>
                  ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_6,_6,_false>
                    *)local_1e8,
                   (Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_> *)&local_228)
        ;
        return true;
      }
      uVar14 = (ulong)(uVar2 & 0x7fffffff);
      this_00 = Traversal::getLink(traversal,uVar14);
      LVar8 = Link::getIndex(this_00);
      pLVar7 = Traversal::getParentLink(traversal,uVar14);
      pIVar10 = Traversal::getParentJoint(traversal,uVar14);
    } while (pLVar7 == (Link *)0x0);
    LVar11 = Link::getIndex(pLVar7);
    pSVar9 = LinkInertias::operator()(linkCRBs,LVar11);
    iVar3 = (*pIVar10->_vptr_IJoint[10])(pIVar10,jointPos,LVar11,LVar8);
    LinkInertias::operator()(linkCRBs,LVar8);
    iDynTree::Transform::operator*
              ((Transform *)local_1e8,(SpatialInertia *)CONCAT44(extraout_var,iVar3));
    iDynTree::SpatialInertia::operator+((SpatialInertia *)local_180,pSVar9);
    pSVar9 = LinkInertias::operator()(linkCRBs,LVar11);
    SpatialInertia::operator=(pSVar9,(SpatialInertia *)local_180);
    iVar3 = (*pIVar10->_vptr_IJoint[4])(pIVar10);
  } while (iVar3 != 1);
  LVar12 = Link::getIndex(this_00);
  (*pIVar10->_vptr_IJoint[0xc])(&local_60,pIVar10,0,LVar12,LVar11);
  pSVar9 = LinkInertias::operator()(linkCRBs,LVar8);
  iDynTree::SpatialInertia::operator*((SpatialInertia *)local_1e8,(SpatialMotionVector *)pSVar9);
  iVar3 = (*pIVar10->_vptr_IJoint[0x18])(pIVar10);
  local_278 = SpatialVector<iDynTree::SpatialMotionVector>::dot(&local_60,(DualVectorT *)local_1e8);
  uVar14 = CONCAT44(extraout_var_00,iVar3) + 6;
  pdVar13 = (double *)iDynTree::MatrixDynSize::operator()((ulong)massMatrix,uVar14);
  do {
    *pdVar13 = local_278;
    do {
      LVar8 = Link::getIndex(this_00);
      pLVar7 = Traversal::getParentLinkFromLinkIndex(traversal,LVar8);
      LVar8 = Link::getIndex(pLVar7);
      pLVar7 = Traversal::getParentLinkFromLinkIndex(traversal,LVar8);
      if (pLVar7 == (Link *)0x0) {
        LVar8 = Link::getIndex(this_00);
        pIVar10 = Traversal::getParentJointFromLinkIndex(traversal,LVar8);
        LVar8 = Link::getIndex(this_00);
        pLVar7 = Traversal::getParentLinkFromLinkIndex(traversal,LVar8);
        LVar8 = Link::getIndex(pLVar7);
        LVar11 = Link::getIndex(this_00);
        iVar3 = (*pIVar10->_vptr_IJoint[10])(pIVar10,jointPos,LVar8,LVar11);
        iDynTree::Transform::Transform
                  ((Transform *)local_180,(Transform *)CONCAT44(extraout_var_03,iVar3));
        iDynTree::Transform::operator*((Transform *)&local_228,(SpatialForceVector *)local_180);
        local_1c0 = local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[5];
        vStack_1b8.m_value = lStack_1f8;
        local_1e8._24_8_ =
             local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[3];
        local_1e8._32_8_ =
             local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[4];
        local_1e8._8_8_ =
             local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[1];
        local_1e8._16_8_ =
             local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[2];
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_228);
        toEigen(&local_228,(SpatialForceVector *)local_1e8);
        local_180._0_8_ = pdVar4 + uVar14;
        local_150.m_value = 0;
        local_140 = 4.94065645841247e-324;
        local_180._16_8_ = pdVar4;
        local_180._24_8_ = dVar5;
        local_180._32_8_ = dVar6;
        local_148.m_value = uVar14;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,6,1,false>,Eigen::Matrix<double,6,1,0,6,1>>
                  ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_6,_1,_false>
                    *)local_180,&local_228);
        local_180._0_8_ = pdVar4 + uVar14 * (long)dVar6;
        local_148.m_value = 0;
        local_180._16_8_ = pdVar4;
        local_180._24_8_ = dVar5;
        local_180._32_8_ = dVar6;
        local_150.m_value = uVar14;
        local_140 = dVar6;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,1,6,false>,Eigen::Matrix<double,6,1,0,6,1>>
                  ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_6,_false>
                    *)local_180,&local_228);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_1e8);
        goto LAB_00193bfd;
      }
      LVar8 = Link::getIndex(this_00);
      pIVar10 = Traversal::getParentJointFromLinkIndex(traversal,LVar8);
      LVar8 = Link::getIndex(this_00);
      pLVar7 = Traversal::getParentLinkFromLinkIndex(traversal,LVar8);
      LVar8 = Link::getIndex(pLVar7);
      LVar11 = Link::getIndex(this_00);
      iVar3 = (*pIVar10->_vptr_IJoint[10])(pIVar10,jointPos,LVar8,LVar11);
      iDynTree::Transform::Transform
                ((Transform *)local_180,(Transform *)CONCAT44(extraout_var_01,iVar3));
      iDynTree::Transform::operator*((Transform *)&local_228,(SpatialForceVector *)local_180);
      local_1c0 = local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array[5];
      vStack_1b8.m_value = lStack_1f8;
      local_1e8._24_8_ =
           local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[3];
      local_1e8._32_8_ =
           local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[4];
      local_1e8._8_8_ =
           local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[1];
      local_1e8._16_8_ =
           local_228.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
           array[2];
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)&local_228);
      LVar8 = Link::getIndex(this_00);
      this_00 = Traversal::getParentLinkFromLinkIndex(traversal,LVar8);
      LVar8 = Link::getIndex(this_00);
      pIVar10 = Traversal::getParentJointFromLinkIndex(traversal,LVar8);
      LVar8 = Link::getIndex(this_00);
      pLVar7 = Traversal::getParentLinkFromLinkIndex(traversal,LVar8);
      LVar8 = Link::getIndex(pLVar7);
      iVar3 = (*pIVar10->_vptr_IJoint[4])(pIVar10);
    } while (iVar3 != 1);
    LVar11 = Link::getIndex(this_00);
    (*pIVar10->_vptr_IJoint[0xc])(local_180,pIVar10,0,LVar11,LVar8);
    iVar3 = (*pIVar10->_vptr_IJoint[0x18])(pIVar10);
    dVar1 = SpatialVector<iDynTree::SpatialMotionVector>::dot
                      ((SpatialVector<iDynTree::SpatialMotionVector> *)local_180,
                       (DualVectorT *)local_1e8);
    pdVar13 = (double *)iDynTree::MatrixDynSize::operator()((ulong)massMatrix,uVar14);
    *pdVar13 = dVar1;
    pdVar13 = (double *)iDynTree::MatrixDynSize::operator()((ulong)massMatrix,uVar14);
    local_278 = *pdVar13;
    pdVar13 = (double *)
              iDynTree::MatrixDynSize::operator()
                        ((ulong)massMatrix,CONCAT44(extraout_var_02,iVar3) + 6);
  } while( true );
}

Assistant:

bool CompositeRigidBodyAlgorithm(const Model& model,
                                 const Traversal& traversal,
                                 const JointPosDoubleArray& jointPos,
                                 LinkCompositeRigidBodyInertias& linkCRBs,
                                 FreeFloatingMassMatrix& massMatrix)
{
    // Map the massMatrix to an Eigen matrix
    Eigen::Map<Eigen::Matrix<double,Eigen::Dynamic,Eigen::Dynamic,Eigen::RowMajor> >
        massMatrixEigen(massMatrix.data(),massMatrix.rows(),massMatrix.cols());

    /**
     * Forward pass: initialize the CRBI
     * of each link to its own inertia.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        linkCRBs(visitedLinkIndex) = visitedLink->getInertia();
    }

    /**
     * Backward pass: for each link compute the
     * CRB of the link (given the traversal).
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // If the visited link is not the base one, add its
        // CRBI to the CRBI of the parent
        // \todo TODO streamline the check "is Link the floating base"
        // given a traversal
        if( parentLink )
        {
            LinkIndex parentLinkIndex = parentLink->getIndex();

            linkCRBs(parentLinkIndex) = linkCRBs(parentLinkIndex) +
                (toParentJoint->getTransform(jointPos,parentLinkIndex,visitedLinkIndex))*linkCRBs(visitedLinkIndex);

            // For now we just implement the CRBA for 0 or 1 dofs joints.
            assert( toParentJoint->getNrOfDOFs() <= 1 );

            // If the visited link is attached to its parent with a fixed joint,
            // we don't need to do anything else for this link.
            // Otherwise we need to compute the rows and columns of the mass matrix
            // related to the dof connecting the visited link to its parent
            if( toParentJoint->getNrOfDOFs() == 1 )
            {
                // In this loop we follow the algorith as described in
                // in Featherstone 2008 , Table 6.2 . In particular S_visitedDof (S_i in the book)
                // is the motion subspace vector connected to the degree of freedom connecting the link to its parent,
                // while S_ancestorDof (S_j in the book) is the motion subspace vector of its ancestor considered in the
                // inner loop
                SpatialMotionVector S_visitedDof = toParentJoint->getMotionSubspaceVector(0,visitedLink->getIndex(),parentLinkIndex);
                SpatialForceVector  F = linkCRBs(visitedLinkIndex)*S_visitedDof;

                // We compute the term of the mass matrix on the diagonal
                // (in the book: H_ii = S_i^\top F
                size_t dofIndex = toParentJoint->getDOFsOffset();
                massMatrix(6+dofIndex,6+dofIndex) = S_visitedDof.dot(F);

                // Then we compute all the off-diagonal terms relative to
                // the ancestors of the currently visited link

                // j = i
                LinkConstPtr ancestor = visitedLink;

                // while lambda(j) != 0
                while( traversal.getParentLinkFromLinkIndex(traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex()) )
                {
                    {
                        IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                        LinkIndex      ancestorParent =        traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();
                        Transform ancestorParent_X_ancestor = ancestorToParentJoint->getTransform(jointPos,ancestorParent,ancestor->getIndex());
                        F = ancestorParent_X_ancestor*F;
                    }

                    // j = \lambda(j)

                    ancestor = traversal.getParentLinkFromLinkIndex(ancestor->getIndex());

                    IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                    LinkIndex      ancestorParentIndex   = traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();

                    // For now we just implement the CRBA for 0 or 1 dofs joints.
                    assert( ancestorToParentJoint->getNrOfDOFs() <= 1 );

                    if( ancestorToParentJoint->getNrOfDOFs() == 1 )
                    {
                        SpatialMotionVector S_ancestorDof =
                            ancestorToParentJoint->getMotionSubspaceVector(0,ancestor->getIndex(),ancestorParentIndex);
                        size_t ancestorDofIndex = ancestorToParentJoint->getDOFsOffset();

                        // H_ij = F^\top S_j
                        // H_ji = H_ij^\top
                        massMatrix(6+dofIndex,6+ancestorDofIndex) = S_ancestorDof.dot(F);
                        massMatrix(6+ancestorDofIndex,6+dofIndex) = massMatrix(6+dofIndex,6+ancestorDofIndex);
                    }
                }

                // We need to write F in the base link for the off-diagonal term of the mass matrix
                {
                    IJointConstPtr ancestorToParentJoint = traversal.getParentJointFromLinkIndex(ancestor->getIndex());
                    LinkIndex      ancestorParent =        traversal.getParentLinkFromLinkIndex(ancestor->getIndex())->getIndex();
                    Transform ancestorParent_X_ancestor = ancestorToParentJoint->getTransform(jointPos,ancestorParent,ancestor->getIndex());
                    F = ancestorParent_X_ancestor*F;
                }

                // Fill the 6 \times nDof right top submatrix of the mass matrix
                // (i.e. the jacobian of the momentum)
                Eigen::Matrix<double,6,1> FEigen = toEigen(F);
                massMatrixEigen.block<6,1>(0,6+dofIndex) = FEigen;
                massMatrixEigen.block<1,6>(6+dofIndex,0) = FEigen;
            }

        }
    }

    // Fill the top left 6x6 matrix: it is just the composite rigid body inertia of all the body
    Matrix6x6 lockedInertia = linkCRBs(traversal.getLink(0)->getIndex()).asMatrix();
    massMatrixEigen.block<6,6>(0,0) = toEigen(lockedInertia);

    return true;
}